

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hopMem.c
# Opt level: O2

void Hop_ManAddMemory(Hop_Man_t *p)

{
  Hop_Obj_t *Entry;
  int iVar1;
  void *Entry_00;
  long lVar2;
  bool bVar3;
  
  if (p->pListFree == (Hop_Obj_t *)0x0) {
    Entry_00 = malloc(0x28040);
    Vec_PtrPush(p->vChunks,Entry_00);
    Entry = (Hop_Obj_t *)(((ulong)Entry_00 & 0xffffffffffffffc0) + 0x40);
    Vec_PtrPush(p->vPages,Entry);
    p->pListFree = Entry;
    lVar2 = ((ulong)Entry_00 & 0xffffffffffffffc0) + 0x68;
    iVar1 = 0xfff;
    while (bVar3 = iVar1 != 0, iVar1 = iVar1 + -1, bVar3) {
      *(long *)(lVar2 + -0x28) = lVar2;
      lVar2 = lVar2 + 0x28;
    }
    *(undefined8 *)(lVar2 + -0x28) = 0;
    return;
  }
  __assert_fail("p->pListFree == NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/hop/hopMem.c"
                ,0x5e,"void Hop_ManAddMemory(Hop_Man_t *)");
}

Assistant:

void Hop_ManAddMemory( Hop_Man_t * p )
{
    char * pMemory;
    int i, nBytes;
    assert( sizeof(Hop_Obj_t) <= 64 );
    assert( p->pListFree == NULL );
//    assert( (Hop_ManObjNum(p) & IVY_PAGE_MASK) == 0 );
    // allocate new memory page
    nBytes = sizeof(Hop_Obj_t) * (1<<IVY_PAGE_SIZE) + 64;
    pMemory = ABC_ALLOC( char, nBytes );
    Vec_PtrPush( p->vChunks, pMemory );
    // align memory at the 32-byte boundary
    pMemory = pMemory + 64 - (((int)(ABC_PTRUINT_T)pMemory) & 63);
    // remember the manager in the first entry
    Vec_PtrPush( p->vPages, pMemory );
    // break the memory down into nodes
    p->pListFree = (Hop_Obj_t *)pMemory;
    for ( i = 1; i <= IVY_PAGE_MASK; i++ )
    {
        *((char **)pMemory) = pMemory + sizeof(Hop_Obj_t);
        pMemory += sizeof(Hop_Obj_t);
    }
    *((char **)pMemory) = NULL;
}